

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O2

cl_context
clCreateContext(cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
               _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
               cl_int *errcode_ret)

{
  cl_device_id *pp_Var1;
  Device *device;
  cl_int cVar2;
  Context *this;
  Platform *obj;
  ulong uVar3;
  Device *obj_1;
  
  if ((properties == (cl_context_properties *)0x0) || (*properties == 0)) {
LAB_001049bc:
    if ((num_devices == 0 || devices == (cl_device_id *)0x0) ||
       (pfn_notify == (_func_void_char_ptr_void_ptr_size_t_void_ptr *)0x0 &&
        user_data != (void *)0x0)) {
      *errcode_ret = -0x1e;
    }
    else {
      uVar3 = 0;
      do {
        if (num_devices == uVar3) {
          if (num_devices == 1) {
            device = (Device *)*devices;
            this = (Context *)operator_new(0x40,(nothrow_t *)&std::nothrow);
            if (this == (Context *)0x0) {
              cVar2 = -6;
            }
            else {
              cov::Context::Context(this,device,pfn_notify,user_data);
              *(undefined4 *)
               &this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>.m_icdTable = 1;
              cVar2 = 0;
              if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>).m_initSuccess !=
                  false) goto LAB_00104806;
              cov::Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>_&>::release
                        ((Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)4>_&> *)this);
              cVar2 = -5;
            }
          }
          else {
            cVar2 = -2;
          }
          this = (Context *)0x0;
LAB_00104806:
          *errcode_ret = cVar2;
          return (cl_context)this;
        }
        pp_Var1 = devices + uVar3;
        uVar3 = uVar3 + 1;
      } while ((*pp_Var1)[8] == (_cl_device_id)0x2);
      *errcode_ret = -0x21;
    }
  }
  else {
    if (*properties == 0x1084) {
      if (*(char *)(properties[1] + 8) != '\x01') {
        *errcode_ret = -0x20;
        return (cl_context)0x0;
      }
      if (properties[2] == 0) goto LAB_001049bc;
    }
    *errcode_ret = -0x40;
  }
  return (cl_context)0x0;
}

Assistant:

CL_API_ENTRY cl_context CL_API_CALL
clCreateContext(const cl_context_properties* properties,
                cl_uint num_devices,
                const cl_device_id* devices,
                void (CL_CALLBACK* pfn_notify)(const char* errinfo,
                                               const void* private_info,
                                               size_t cb,
                                               void* user_data),
                void* user_data,
                cl_int* errcode_ret) CL_API_SUFFIX__VERSION_1_0
{
    if (properties) {
        uint32_t i = 0;
        bool hasPlatformProperties = false;
        while (properties[i] != 0) {
            if (properties[i] == CL_CONTEXT_PLATFORM) {
                if (hasPlatformProperties) {
                    *errcode_ret = CL_INVALID_PROPERTY;
                    return nullptr;
                }
                if (!cov::isValidObject<cov::Platform>(reinterpret_cast<void*>(properties[i + 1]))) {
                    *errcode_ret = CL_INVALID_PLATFORM;
                    return nullptr;
                }
                hasPlatformProperties = true; // platform here not actually used
            } else {
                *errcode_ret = CL_INVALID_PROPERTY;
                return nullptr;
            }
            i += 2;
        }
    }
    if (!devices || num_devices == 0) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    if (!pfn_notify && user_data) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }
    for (cl_uint i = 0; i < num_devices; i++) {
        if (!cov::isValidObject<cov::Device>(devices[i])) {
            *errcode_ret = CL_INVALID_DEVICE;
            return nullptr;
        }
    }

    return cov::createContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
}